

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void sequential_row(standard_display *dp,png_structp pp,png_infop pi,int iImage,int iDisplay)

{
  int iVar1;
  png_store *ps_00;
  png_uint_32 pVar2;
  png_uint_32 pVar3;
  png_bytep ppVar4;
  bool bVar5;
  png_bytep local_890;
  png_bytep local_880;
  byte local_870;
  byte local_864;
  png_byte local_858 [8];
  png_byte display [1024];
  png_byte row [1024];
  uint local_48;
  png_uint_32 wPass;
  png_uint_32 y;
  int pass;
  png_store *ps;
  png_uint_32 width;
  png_uint_32 height;
  int do_interlace;
  int npasses;
  int iDisplay_local;
  int iImage_local;
  png_infop pi_local;
  png_structp pp_local;
  standard_display *dp_local;
  
  iVar1 = dp->npasses;
  bVar5 = false;
  if (dp->do_interlace != 0) {
    bVar5 = dp->interlace_type == '\x01';
  }
  pVar2 = standard_height(pp,dp->id);
  pVar3 = standard_width(pp,dp->id);
  ps_00 = dp->ps;
  for (wPass = 0; (int)wPass < iVar1; wPass = wPass + 1) {
    if ((int)wPass < 2) {
      local_864 = 3;
    }
    else {
      local_864 = (byte)((int)(7 - wPass) >> 1);
    }
    if ((int)wPass < 2) {
      local_870 = 3;
    }
    else {
      local_870 = (byte)((int)(7 - wPass) >> 1);
    }
    for (local_48 = 0; local_48 < pVar2; local_48 = local_48 + 1) {
      if (bVar5) {
        if ((pVar3 + (((1 << (local_864 & 0x1f)) + -1) -
                     ((wPass & 1) << (3U - (char)((int)(wPass + 1) >> 1) & 0x1f) & 7)) >>
             (local_870 & 0x1f) != 0) &&
           (((int)(0x110145af >> (('\a' - (char)wPass) * '\x04' & 0x1fU) & 0xfU |
                  0x1145af0 >> (('\a' - (char)wPass) * '\x04' & 0x1fU) & 0xf0U) >>
             ((byte)local_48 & 7) & 1U) != 0)) {
          memset(display + 0x3f8,0xc5,0x400);
          memset(local_858,0x5c,0x400);
          png_read_row(pp,display + 0x3f8,local_858);
          if (-1 < iImage) {
            ppVar4 = store_image_row(ps_00,pp,iImage,local_48);
            deinterlace_row(ppVar4,display + 0x3f8,dp->pixel_size,dp->w,wPass,dp->littleendian);
          }
          if (-1 < iDisplay) {
            ppVar4 = store_image_row(ps_00,pp,iDisplay,local_48);
            deinterlace_row(ppVar4,local_858,dp->pixel_size,dp->w,wPass,dp->littleendian);
          }
        }
      }
      else {
        if (iImage < 0) {
          local_880 = (png_bytep)0x0;
        }
        else {
          local_880 = store_image_row(ps_00,pp,iImage,local_48);
        }
        if (iDisplay < 0) {
          local_890 = (png_bytep)0x0;
        }
        else {
          local_890 = store_image_row(ps_00,pp,iDisplay,local_48);
        }
        png_read_row(pp,local_880,local_890);
      }
    }
  }
  png_read_end(pp,pi);
  return;
}

Assistant:

static void
sequential_row(standard_display *dp, png_structp pp, png_infop pi,
    int iImage, int iDisplay)
{
   int npasses = dp->npasses;
   int do_interlace = dp->do_interlace &&
      dp->interlace_type == PNG_INTERLACE_ADAM7;
   png_uint_32 height = standard_height(pp, dp->id);
   png_uint_32 width = standard_width(pp, dp->id);
   const png_store* ps = dp->ps;
   int pass;

   for (pass=0; pass<npasses; ++pass)
   {
      png_uint_32 y;
      png_uint_32 wPass = PNG_PASS_COLS(width, pass);

      for (y=0; y<height; ++y)
      {
         if (do_interlace)
         {
            /* wPass may be zero or this row may not be in this pass.
             * png_read_row must not be called in either case.
             */
            if (wPass > 0 && PNG_ROW_IN_INTERLACE_PASS(y, pass))
            {
               /* Read the row into a pair of temporary buffers, then do the
                * merge here into the output rows.
                */
               png_byte row[STANDARD_ROWMAX], display[STANDARD_ROWMAX];

               /* The following aids (to some extent) error detection - we can
                * see where png_read_row wrote.  Use opposite values in row and
                * display to make this easier.  Don't use 0xff (which is used in
                * the image write code to fill unused bits) or 0 (which is a
                * likely value to overwrite unused bits with).
                */
               memset(row, 0xc5, sizeof row);
               memset(display, 0x5c, sizeof display);

               png_read_row(pp, row, display);

               if (iImage >= 0)
                  deinterlace_row(store_image_row(ps, pp, iImage, y), row,
                     dp->pixel_size, dp->w, pass, dp->littleendian);

               if (iDisplay >= 0)
                  deinterlace_row(store_image_row(ps, pp, iDisplay, y), display,
                     dp->pixel_size, dp->w, pass, dp->littleendian);
            }
         }
         else
            png_read_row(pp,
               iImage >= 0 ? store_image_row(ps, pp, iImage, y) : NULL,
               iDisplay >= 0 ? store_image_row(ps, pp, iDisplay, y) : NULL);
      }
   }

   /* And finish the read operation (only really necessary if the caller wants
    * to find additional data in png_info from chunks after the last IDAT.)
    */
   png_read_end(pp, pi);
}